

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexBaseExc.cpp
# Opt level: O0

void __thiscall Iex_2_5::BaseExc::BaseExc(BaseExc *this,stringstream *s)

{
  exception *in_RDI;
  allocator<char> *unaff_retaddr;
  char *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  allocator<char> local_11 [17];
  
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__BaseExc_00174688;
  std::__cxx11::stringstream::str();
  if ((anonymous_namespace)::currentStackTracer_abi_cxx11_ == (code *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_00000010,in_stack_00000008,unaff_retaddr);
    std::allocator<char>::~allocator(local_11);
  }
  else {
    (*(anonymous_namespace)::currentStackTracer_abi_cxx11_)(in_RDI + 0x28);
  }
  return;
}

Assistant:

BaseExc::BaseExc (std::stringstream &s) throw () :
    _message (s.str()),
    _stackTrace (currentStackTracer? currentStackTracer(): "")
{
    // empty
}